

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O3

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstanceBase::initialize
          (DrawTestInstanceBase *this,DrawParamsBase *data)

{
  Move<vk::Handle<(vk::HandleType)16>_> *pMVar1;
  int *piVar2;
  deInt32 *pdVar3;
  Move<vk::Handle<(vk::HandleType)13>_> *pMVar4;
  Move<vk::Handle<(vk::HandleType)17>_> *pMVar5;
  VkFormat _format;
  VkPipelineLayout obj;
  DeviceInterface *pDVar6;
  SharedPtrStateBase *pSVar7;
  VkImage _image;
  VkImageView obj_00;
  VkRenderPass obj_01;
  VkFramebuffer obj_02;
  Allocation *pAVar8;
  VkPipelineShaderStageCreateInfo *__dest;
  Buffer *pBVar9;
  VkCommandPool obj_03;
  VkPipeline obj_04;
  VkSubpassDescription subpass;
  StencilOpState _front;
  VkAttachmentDescription attachment;
  StencilOpState _back;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  Handle<(vk::HandleType)18> HVar14;
  VkAllocationCallbacks *pVVar15;
  void *pvVar16;
  VkAttachmentDescription *pVVar17;
  deUint32 dVar18;
  VkDevice pVVar19;
  Allocator *pAVar20;
  const_iterator cVar21;
  long lVar22;
  PipelineCreateInfo *pPVar23;
  undefined8 *puVar24;
  VkDeviceSize _size;
  byte bVar25;
  VkExtent3D _extent;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  VkAttachmentReference *_colorAttachments;
  undefined4 uVar34;
  undefined4 uVar35;
  deUint32 dVar36;
  VkImageLayout VVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined1 local_748 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_738;
  VkPipelineColorBlendAttachmentState *local_728;
  VkAllocationCallbacks *pVStack_720;
  pointer local_718;
  pointer local_710;
  pointer local_708;
  pointer local_700;
  pointer local_6f0;
  deUint32 local_6dc;
  Move<vk::Handle<(vk::HandleType)18>_> local_6d8;
  vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> local_6b8;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  colorAttachments;
  vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> local_678;
  Move<vk::Handle<(vk::HandleType)17>_> *local_660;
  Move<vk::Handle<(vk::HandleType)16>_> *local_658;
  VkAttachmentReference colorAttachmentReference;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_640;
  VkShaderModule local_628;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_620;
  PipelineCreateInfo pipelineCreateInfo;
  VkStencilOpState local_318;
  VkStencilOpState local_2f8;
  RenderPassCreateInfo renderPassCreateInfo;
  CmdPoolCreateInfo cmdPoolCreateInfo;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
  Attachment vkCbAttachmentState;
  ImageCreateInfo targetImageCreateInfo;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  FramebufferCreateInfo framebufferCreateInfo;
  ImageViewCreateInfo colorTargetViewInfo;
  
  bVar25 = 0;
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  operator=(&(this->m_data).vertices,&data->vertices);
  (this->m_data).topology = data->topology;
  pVVar19 = Context::getDevice((this->super_TestInstance).m_context);
  dVar18 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)0x0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount = 0;
  PipelineLayoutCreateInfo::PipelineLayoutCreateInfo
            (&pipelineLayoutCreateInfo,
             (vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
              *)&pipelineCreateInfo,0,(VkPushConstantRange *)0x0);
  if (pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_ != 0) {
    operator_delete((void *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_,
                    pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_ -
                    pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_);
  }
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&renderPassCreateInfo,this->m_vk,pVVar19,
             &pipelineLayoutCreateInfo.super_VkPipelineLayoutCreateInfo,(VkAllocationCallbacks *)0x0
            );
  pVVar17 = renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments;
  uVar11 = renderPassCreateInfo.super_VkRenderPassCreateInfo._16_8_;
  pvVar16 = renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext;
  uVar10 = renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.flags;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.attachmentCount;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)
       renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.sType;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ =
       renderPassCreateInfo.super_VkRenderPassCreateInfo._4_4_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassCreateInfo.super_VkRenderPassCreateInfo._4_4_ = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.flags = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.attachmentCount = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments = (VkAttachmentDescription *)0x0;
  pMVar1 = &this->m_pipelineLayout;
  obj.m_internal =
       (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
       m_internal;
  if (obj.m_internal == 0) {
    (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device
         = (VkDevice)uVar11;
    (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)pVVar17;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal = uVar10;
    (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)pvVar16;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                deleter,obj);
    (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device
         = (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
    (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)
                  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal =
         pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
    (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
    if (renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)16>_> *)
                 &renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext,
                 (VkPipelineLayout)renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_);
    }
  }
  uVar30 = 0;
  uVar31 = 0;
  uVar28 = 1;
  uVar29 = 0;
  uVar26 = 1;
  uVar27 = 0;
  _extent.depth = 1;
  _extent.width = 0x100;
  _extent.height = 0x100;
  ImageCreateInfo::ImageCreateInfo
            (&targetImageCreateInfo,VK_IMAGE_TYPE_2D,this->m_colorAttachmentFormat,_extent,1,1,
             VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x13,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  pDVar6 = this->m_vk;
  pAVar20 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  Image::createAndAlloc
            ((Image *)&pipelineCreateInfo,pDVar6,pVVar19,
             &targetImageCreateInfo.super_VkImageCreateInfo,pAVar20,(MemoryRequirement)0x0);
  pSVar7 = (this->m_colorTargetImage).m_state;
  if (pSVar7 == (SharedPtrStateBase *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext) {
LAB_006dc2ab:
    if (pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext != (void *)0x0) {
      LOCK();
      piVar2 = (int *)((long)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext + 8);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType =
             VK_STRUCTURE_TYPE_APPLICATION_INFO;
        pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ = 0;
        (**(code **)(*pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext + 0x10))();
      }
      LOCK();
      piVar2 = (int *)((long)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext + 0xc);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) &&
         (pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext != (void *)0x0)) {
        (**(code **)(*pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext + 8))();
      }
    }
  }
  else {
    if (pSVar7 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar3 = &pSVar7->strongRefCount;
      *pdVar3 = *pdVar3 + -1;
      UNLOCK();
      if (*pdVar3 == 0) {
        (this->m_colorTargetImage).m_ptr = (Image *)0x0;
        (*((this->m_colorTargetImage).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar3 = &((this->m_colorTargetImage).m_state)->weakRefCount;
      *pdVar3 = *pdVar3 + -1;
      UNLOCK();
      if (*pdVar3 == 0) {
        pSVar7 = (this->m_colorTargetImage).m_state;
        if (pSVar7 != (SharedPtrStateBase *)0x0) {
          (*pSVar7->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_colorTargetImage).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_colorTargetImage).m_ptr =
         (Image *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
    (this->m_colorTargetImage).m_state =
         (SharedPtrStateBase *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
    if (pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext != (void *)0x0) {
      LOCK();
      *(int *)((long)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext + 8) =
           *(int *)((long)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext + 8) + 1;
      UNLOCK();
      LOCK();
      pdVar3 = &((this->m_colorTargetImage).m_state)->weakRefCount;
      *pdVar3 = *pdVar3 + 1;
      UNLOCK();
      goto LAB_006dc2ab;
    }
  }
  _image.m_internal =
       (((this->m_colorTargetImage).m_ptr)->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
       m_data.object.m_internal;
  _format = this->m_colorAttachmentFormat;
  ComponentMapping::ComponentMapping
            ((ComponentMapping *)&pipelineCreateInfo,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G,
             VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  ImageViewCreateInfo::ImageViewCreateInfo
            (&colorTargetViewInfo,_image,VK_IMAGE_VIEW_TYPE_2D,_format,
             (VkComponentMapping *)&pipelineCreateInfo,0);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&renderPassCreateInfo,this->m_vk,pVVar19,
             &colorTargetViewInfo.super_VkImageViewCreateInfo,(VkAllocationCallbacks *)0x0);
  pVVar17 = renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments;
  uVar11 = renderPassCreateInfo.super_VkRenderPassCreateInfo._16_8_;
  pvVar16 = renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext;
  uVar10 = renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.flags;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.attachmentCount;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)
       renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.sType;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ =
       renderPassCreateInfo.super_VkRenderPassCreateInfo._4_4_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext =
       renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassCreateInfo.super_VkRenderPassCreateInfo._4_4_ = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.flags = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.attachmentCount = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments = (VkAttachmentDescription *)0x0;
  pMVar4 = &this->m_colorTargetView;
  obj_00.m_internal =
       (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  if (obj_00.m_internal == 0) {
    (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device
         = (VkDevice)uVar11;
    (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)pVVar17;
    (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal = uVar10;
    (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)pvVar16;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                deleter,obj_00);
    (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device
         = (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
    (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)
                  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
    (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
    (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
    if (renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)13>_> *)
                 &renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext,
                 (VkImageView)renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_);
    }
  }
  RenderPassCreateInfo::RenderPassCreateInfo
            (&renderPassCreateInfo,0,(VkAttachmentDescription *)0x0,0,(VkSubpassDescription *)0x0,0,
             (VkSubpassDependency *)0x0);
  AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)&pipelineCreateInfo,this->m_colorAttachmentFormat,
             VK_SAMPLE_COUNT_1_BIT,VK_ATTACHMENT_LOAD_OP_LOAD,VK_ATTACHMENT_STORE_OP_STORE,
             VK_ATTACHMENT_LOAD_OP_DONT_CARE,VK_ATTACHMENT_STORE_OP_STORE,VK_IMAGE_LAYOUT_GENERAL,
             VK_IMAGE_LAYOUT_GENERAL);
  attachment.samples = (int)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  attachment.flags = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType;
  attachment.format = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_;
  attachment.loadOp =
       (int)((ulong)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext >> 0x20);
  attachment.storeOp = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags;
  attachment.stencilLoadOp = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount;
  attachment.stencilStoreOp = (int)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  attachment.initialLayout =
       (int)((ulong)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages >> 0x20);
  attachment.finalLayout =
       (VkImageLayout)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pVertexInputState;
  RenderPassCreateInfo::addAttachment(&renderPassCreateInfo,attachment);
  colorAttachmentReference.attachment = 0;
  colorAttachmentReference.layout = VK_IMAGE_LAYOUT_GENERAL;
  AttachmentReference::AttachmentReference((AttachmentReference *)local_748);
  _colorAttachments = &colorAttachmentReference;
  uVar40 = 0;
  uVar41 = 0;
  uVar38 = 0;
  uVar39 = 0;
  dVar36 = (deUint32)local_748._0_8_;
  VVar37 = SUB84(local_748._0_8_,4);
  uVar34 = 0;
  uVar35 = 0;
  uVar32 = 0x6dc4df;
  uVar33 = 0;
  SubpassDescription::SubpassDescription
            ((SubpassDescription *)&pipelineCreateInfo,VK_PIPELINE_BIND_POINT_GRAPHICS,0,0,
             (VkAttachmentReference *)0x0,1,_colorAttachments,(VkAttachmentReference *)0x0,
             (VkAttachmentReference)local_748._0_8_,0,(deUint32 *)0x0);
  lVar22 = 9;
  pPVar23 = &pipelineCreateInfo;
  puVar24 = (undefined8 *)&stack0xfffffffffffff868;
  while( true ) {
    if (lVar22 == 0) break;
    lVar22 = lVar22 + -1;
    *puVar24 = *(undefined8 *)&pPVar23->super_VkGraphicsPipelineCreateInfo;
    pPVar23 = (PipelineCreateInfo *)((long)pPVar23 + (ulong)bVar25 * -0x10 + 8);
    puVar24 = puVar24 + (ulong)bVar25 * -2 + 1;
  }
  subpass.pipelineBindPoint = uVar27;
  subpass.flags = uVar26;
  subpass.inputAttachmentCount = uVar28;
  subpass._12_4_ = uVar29;
  subpass.pInputAttachments._0_4_ = uVar30;
  subpass.pInputAttachments._4_4_ = uVar31;
  subpass.colorAttachmentCount = uVar32;
  subpass._28_4_ = uVar33;
  subpass.pColorAttachments._0_4_ = (int)_colorAttachments;
  subpass.pColorAttachments._4_4_ = (int)((ulong)_colorAttachments >> 0x20);
  subpass.pResolveAttachments._0_4_ = uVar34;
  subpass.pResolveAttachments._4_4_ = uVar35;
  subpass.pDepthStencilAttachment._0_4_ = dVar36;
  subpass.pDepthStencilAttachment._4_4_ = VVar37;
  subpass.preserveAttachmentCount = uVar38;
  subpass._60_4_ = uVar39;
  subpass.pPreserveAttachments._0_4_ = uVar40;
  subpass.pPreserveAttachments._4_4_ = uVar41;
  RenderPassCreateInfo::addSubpass(&renderPassCreateInfo,subpass);
  if (pipelineCreateInfo.m_shaders.
      super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_shaders.
                    super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_shaders.
                          super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_shaders.
                          super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._120_8_ != 0) {
    operator_delete((void *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._120_8_,
                    pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._136_8_ -
                    pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._120_8_);
  }
  if (pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pDynamicState !=
      (VkPipelineDynamicStateCreateInfo *)0x0) {
    operator_delete(pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pDynamicState,
                    pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.renderPass.m_internal -
                    (long)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pDynamicState);
  }
  if (pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pMultisampleState !=
      (VkPipelineMultisampleStateCreateInfo *)0x0) {
    operator_delete(pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pMultisampleState,
                    (long)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pColorBlendState -
                    (long)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pMultisampleState);
  }
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)local_748,this->m_vk,pVVar19,
             &renderPassCreateInfo.super_VkRenderPassCreateInfo,(VkAllocationCallbacks *)0x0);
  uVar13 = local_738._8_8_;
  uVar12 = local_738._M_allocated_capacity;
  uVar11 = local_748._8_8_;
  uVar10 = local_748._0_8_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags =
       local_738._M_allocated_capacity._0_4_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount =
       local_738._M_allocated_capacity._4_4_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)local_738._8_8_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_ = local_748._0_8_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)local_748._8_8_;
  local_748._0_4_ = 0;
  local_748._4_4_ = VK_IMAGE_LAYOUT_UNDEFINED;
  local_748._8_8_ = (DeviceInterface *)0x0;
  local_738._M_allocated_capacity = 0;
  local_738._8_8_ = (VkPipelineShaderStageCreateInfo *)0x0;
  pMVar5 = &this->m_renderPass;
  obj_01.m_internal =
       (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  if (obj_01.m_internal == 0) {
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
         (VkDevice)uVar12;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)uVar13;
    (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal = uVar10;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)uVar11;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               obj_01);
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
         (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
    (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
         pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
    if ((VkAttachmentReference)local_748._0_8_ != (VkAttachmentReference)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)17>_> *)(local_748 + 8),
                 (VkRenderPass)local_748._0_8_);
    }
  }
  colorAttachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  colorAttachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  colorAttachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  colorAttachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
  colorAttachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       colorAttachments.
       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 1;
  (colorAttachments.
   super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->m_internal =
       (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  colorAttachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       colorAttachments.
       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  FramebufferCreateInfo::FramebufferCreateInfo
            (&framebufferCreateInfo,
             (VkRenderPass)
             (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal,
             &colorAttachments,0x100,0x100,1);
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)local_748,this->m_vk,pVVar19,
             &framebufferCreateInfo.super_VkFramebufferCreateInfo,(VkAllocationCallbacks *)0x0);
  uVar13 = local_738._8_8_;
  uVar12 = local_738._M_allocated_capacity;
  uVar11 = local_748._8_8_;
  uVar10 = local_748._0_8_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags =
       local_738._M_allocated_capacity._0_4_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount =
       local_738._M_allocated_capacity._4_4_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)local_738._8_8_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_ = local_748._0_8_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)local_748._8_8_;
  local_748._0_4_ = 0;
  local_748._4_4_ = VK_IMAGE_LAYOUT_UNDEFINED;
  local_748._8_8_ = (SharedPtrStateBase *)0x0;
  local_738._M_allocated_capacity = 0;
  local_738._8_8_ = (VkAllocationCallbacks *)0x0;
  obj_02.m_internal =
       (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal
  ;
  if (obj_02.m_internal == 0) {
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
         (VkDevice)uVar12;
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator
         = (VkAllocationCallbacks *)uVar13;
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
         uVar10;
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)uVar11;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               obj_02);
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
         (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator
         = (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
         pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
    if ((VkAttachmentReference)local_748._0_8_ != (VkAttachmentReference)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)23>_> *)(local_748 + 8),
                 (VkFramebuffer)local_748._0_8_);
    }
  }
  vertexInputBindingDescription.binding = 0;
  vertexInputBindingDescription.stride = 0x20;
  vertexInputBindingDescription.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  vertexInputAttributeDescriptions[1].location = 1;
  vertexInputAttributeDescriptions[1].binding = 0;
  vertexInputAttributeDescriptions[1].format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexInputAttributeDescriptions[1].offset = 0x10;
  vertexInputAttributeDescriptions[0].location = 0;
  vertexInputAttributeDescriptions[0].binding = 0;
  vertexInputAttributeDescriptions[0].format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexInputAttributeDescriptions[0].offset = 0;
  local_660 = pMVar5;
  PipelineCreateInfo::VertexInputState::VertexInputState
            ((VertexInputState *)&pipelineCreateInfo,1,&vertexInputBindingDescription,2,
             vertexInputAttributeDescriptions);
  *(ulong *)&(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
             vertexAttributeDescriptionCount =
       CONCAT44(pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pVertexInputState._4_4_,
                (VkImageLayout)
                pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pVertexInputState);
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pVertexAttributeDescriptions
       = (VkVertexInputAttributeDescription *)
         pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pInputAssemblyState;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.flags =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
  vertexBindingDescriptionCount = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pVertexBindingDescriptions =
       (VkVertexInputBindingDescription *)
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.sType =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType;
  *(undefined4 *)&(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.field_0x4 =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pNext =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  _size = (long)(this->m_data).vertices.
                super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_data).vertices.
                super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                ._M_impl.super__Vector_impl_data._M_start;
  pDVar6 = this->m_vk;
  BufferCreateInfo::BufferCreateInfo
            ((BufferCreateInfo *)&pipelineCreateInfo,_size,0x80,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0);
  pAVar20 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  Draw::Buffer::createAndAlloc
            ((Buffer *)local_748,pDVar6,pVVar19,(VkBufferCreateInfo *)&pipelineCreateInfo,pAVar20,
             (MemoryRequirement)0x1);
  pSVar7 = (this->m_vertexBuffer).m_state;
  if (pSVar7 != (SharedPtrStateBase *)local_748._8_8_) {
    if (pSVar7 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar3 = &pSVar7->strongRefCount;
      *pdVar3 = *pdVar3 + -1;
      UNLOCK();
      if (*pdVar3 == 0) {
        (this->m_vertexBuffer).m_ptr = (Buffer *)0x0;
        (*((this->m_vertexBuffer).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar3 = &((this->m_vertexBuffer).m_state)->weakRefCount;
      *pdVar3 = *pdVar3 + -1;
      UNLOCK();
      if (*pdVar3 == 0) {
        pSVar7 = (this->m_vertexBuffer).m_state;
        if (pSVar7 != (SharedPtrStateBase *)0x0) {
          (*pSVar7->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_vertexBuffer).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_vertexBuffer).m_ptr = (Buffer *)local_748._0_8_;
    (this->m_vertexBuffer).m_state = (SharedPtrStateBase *)local_748._8_8_;
    if ((SharedPtrStateBase *)local_748._8_8_ == (SharedPtrStateBase *)0x0) goto LAB_006dc8d9;
    LOCK();
    *(deInt32 *)(local_748._8_8_ + 8) = *(deInt32 *)(local_748._8_8_ + 8) + 1;
    UNLOCK();
    LOCK();
    pdVar3 = &((this->m_vertexBuffer).m_state)->weakRefCount;
    *pdVar3 = *pdVar3 + 1;
    UNLOCK();
  }
  if ((SharedPtrStateBase *)local_748._8_8_ != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar3 = (deInt32 *)(local_748._8_8_ + 8);
    *pdVar3 = *pdVar3 + -1;
    UNLOCK();
    if (*pdVar3 == 0) {
      local_748._0_4_ = 0;
      local_748._4_4_ = VK_IMAGE_LAYOUT_UNDEFINED;
      (**(code **)(*(long *)local_748._8_8_ + 0x10))();
    }
    LOCK();
    pdVar3 = (deInt32 *)(local_748._8_8_ + 0xc);
    *pdVar3 = *pdVar3 + -1;
    UNLOCK();
    if (*pdVar3 == 0) {
      if ((SharedPtrStateBase *)local_748._8_8_ != (SharedPtrStateBase *)0x0) {
        (**(code **)(*(long *)local_748._8_8_ + 8))();
      }
      local_748._8_8_ = (SharedPtrStateBase *)0x0;
    }
  }
LAB_006dc8d9:
  local_6dc = dVar18;
  local_658 = pMVar1;
  if (pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pViewportState !=
      (VkPipelineViewportStateCreateInfo *)0x0) {
    operator_delete(pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pViewportState,
                    (long)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pMultisampleState -
                    (long)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pViewportState);
  }
  pAVar8 = (((this->m_vertexBuffer).m_ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_ = &PTR__Allocation_00d1abf8;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext =
       (void *)(pAVar8->m_memory).m_internal;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_ = pAVar8->m_offset;
  __dest = (VkPipelineShaderStageCreateInfo *)pAVar8->m_hostPtr;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages = __dest;
  ::vk::Allocation::~Allocation((Allocation *)&pipelineCreateInfo);
  memcpy(__dest,(this->m_data).vertices.
                super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                ._M_impl.super__Vector_impl_data._M_start,_size);
  pBVar9 = (this->m_vertexBuffer).m_ptr;
  pAVar8 = (pBVar9->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_ = &PTR__Allocation_00d1abf8;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext =
       (void *)(pAVar8->m_memory).m_internal;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_ = pAVar8->m_offset;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)pAVar8->m_hostPtr;
  pAVar8 = (pBVar9->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_748._0_8_ = &PTR__Allocation_00d1abf8;
  local_748._8_8_ = (pAVar8->m_memory).m_internal;
  local_738._M_allocated_capacity = pAVar8->m_offset;
  local_738._8_8_ = pAVar8->m_hostPtr;
  ::vk::flushMappedMemoryRange
            (this->m_vk,pVVar19,
             (VkDeviceMemory)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext,
             local_738._M_allocated_capacity,0xffffffffffffffff);
  ::vk::Allocation::~Allocation((Allocation *)local_748);
  ::vk::Allocation::~Allocation((Allocation *)&pipelineCreateInfo);
  CmdPoolCreateInfo::CmdPoolCreateInfo(&cmdPoolCreateInfo,local_6dc,2);
  pMVar1 = local_658;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)local_748,this->m_vk,pVVar19,
             &cmdPoolCreateInfo.super_VkCommandPoolCreateInfo,(VkAllocationCallbacks *)0x0);
  uVar13 = local_738._8_8_;
  uVar12 = local_738._M_allocated_capacity;
  uVar11 = local_748._8_8_;
  uVar10 = local_748._0_8_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags =
       local_738._M_allocated_capacity._0_4_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount =
       local_738._M_allocated_capacity._4_4_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)local_738._8_8_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_ = local_748._0_8_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)local_748._8_8_;
  local_748._0_4_ = 0;
  local_748._4_4_ = VK_IMAGE_LAYOUT_UNDEFINED;
  local_748._8_8_ = (DeviceInterface *)0x0;
  local_738._M_allocated_capacity = 0;
  local_738._8_8_ = (VkPipelineShaderStageCreateInfo *)0x0;
  obj_03.m_internal =
       (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  if (obj_03.m_internal == 0) {
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
         (VkDevice)uVar12;
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)uVar13;
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
         uVar10;
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)uVar11;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&(this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               obj_03);
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
         (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
         pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
    (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
    if ((VkAttachmentReference)local_748._0_8_ != (VkAttachmentReference)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)24>_> *)(local_748 + 8),
                 (VkCommandPool)local_748._0_8_);
    }
  }
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_748,this->m_vk,pVVar19,
             (VkCommandPool)
             (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
             m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  uVar13 = local_738._8_8_;
  uVar12 = local_738._M_allocated_capacity;
  uVar11 = local_748._8_8_;
  uVar10 = local_748._0_8_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_ = local_738._M_allocated_capacity;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)local_738._8_8_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_ = local_748._0_8_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)local_748._8_8_;
  local_748._0_4_ = 0;
  local_748._4_4_ = VK_IMAGE_LAYOUT_UNDEFINED;
  local_748._8_8_ = (DeviceInterface *)0x0;
  local_738._M_allocated_capacity = 0;
  local_738._8_8_ = (VkAllocationCallbacks *)0x0;
  if ((this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object ==
      (VkCommandBuffer_s *)0x0) {
    (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
         (VkDevice)uVar12;
    (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
         uVar13;
    (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
         (VkCommandBuffer_s *)uVar10;
    (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)uVar11;
  }
  else {
    pDVar6 = (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface
    ;
    (*pDVar6->_vptr_DeviceInterface[0x48])
              (pDVar6,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                      m_device,
               (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
               m_internal,1);
    *(VkPipelineCreateFlags *)
     &(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
         pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags;
    *(deUint32 *)
     ((long)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device + 4)
         = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount;
    *(undefined4 *)
     &(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
         pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages._0_4_;
    *(undefined4 *)
     ((long)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
             m_internal + 4) = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages._4_4_;
    *(VkStructureType *)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
         pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType;
    *(undefined4 *)
     ((long)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object + 4) =
         pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_;
    *(undefined4 *)
     &(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
         pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext._0_4_;
    *(undefined4 *)
     ((long)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface
     + 4) = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext._4_4_;
    if ((VkAttachmentReference)local_748._0_8_ != (VkAttachmentReference)0x0) {
      pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_ = local_748._0_8_;
      (*(*(_func_int ***)local_748._8_8_)[0x48])
                (local_748._8_8_,local_738._M_allocated_capacity,local_738._8_8_,1);
    }
  }
  pDVar6 = this->m_vk;
  local_748._8_8_ = (DeviceInterface *)0x4;
  local_738._M_allocated_capacity._0_5_ = 0x74726576;
  local_748._0_8_ = &local_738;
  cVar21 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)((this->super_TestInstance).m_context)->m_progCollection,(key_type *)local_748)
  ;
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo,pDVar6,pVVar19,
             *(ProgramBinary **)(cVar21._M_node + 2),0);
  uVar10 = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  DStack_640.m_device = (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  DStack_640.m_allocator =
       (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  DStack_640.m_deviceIface =
       (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)0x0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._0_8_ != &local_738) {
    operator_delete((void *)local_748._0_8_,(ulong)(local_738._M_allocated_capacity + 1));
  }
  pDVar6 = this->m_vk;
  local_748._8_8_ = (DeviceInterface *)0x4;
  local_738._M_allocated_capacity._0_5_ = 0x67617266;
  local_748._0_8_ = &local_738;
  cVar21 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)((this->super_TestInstance).m_context)->m_progCollection,(key_type *)local_748)
  ;
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo,pDVar6,pVVar19,
             *(ProgramBinary **)(cVar21._M_node + 2),0);
  DStack_620.m_device = (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  DStack_620.m_allocator =
       (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  local_628.m_internal = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  DStack_620.m_deviceIface =
       (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)0x0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._0_8_ != &local_738) {
    operator_delete((void *)local_748._0_8_,(ulong)(local_738._M_allocated_capacity + 1));
  }
  PipelineCreateInfo::ColorBlendState::Attachment::Attachment
            (&vkCbAttachmentState,0,VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,
             VK_BLEND_OP_ADD,VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,0xf
            );
  PipelineCreateInfo::PipelineCreateInfo
            (&pipelineCreateInfo,
             (VkPipelineLayout)
             (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal,
             (VkRenderPass)
             (local_660->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal,0,
             0);
  PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)local_748,(VkShaderModule)uVar10,"main",
             VK_SHADER_STAGE_VERTEX_BIT);
  PipelineCreateInfo::addShader(&pipelineCreateInfo,(VkPipelineShaderStageCreateInfo *)local_748);
  PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)local_748,local_628,"main",VK_SHADER_STAGE_FRAGMENT_BIT);
  PipelineCreateInfo::addShader(&pipelineCreateInfo,(VkPipelineShaderStageCreateInfo *)local_748);
  local_748._0_4_ = (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.sType;
  local_748._4_4_ =
       *(undefined4 *)
        &(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.field_0x4;
  local_748._8_8_ = (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pNext;
  local_738._M_allocated_capacity =
       *(undefined8 *)&(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.flags;
  local_738._8_8_ =
       (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
       pVertexBindingDescriptions;
  local_728 = *(VkPipelineColorBlendAttachmentState **)
               &(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
                vertexAttributeDescriptionCount;
  pVStack_720 = (VkAllocationCallbacks *)
                (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
                pVertexAttributeDescriptions;
  PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineVertexInputStateCreateInfo *)local_748);
  PipelineCreateInfo::InputAssemblerState::InputAssemblerState
            ((InputAssemblerState *)local_748,(this->m_data).topology,0);
  PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineInputAssemblyStateCreateInfo *)local_748);
  PipelineCreateInfo::ColorBlendState::ColorBlendState
            ((ColorBlendState *)local_748,1,
             &vkCbAttachmentState.super_VkPipelineColorBlendAttachmentState,0,VK_LOGIC_OP_COPY);
  PipelineCreateInfo::addState(&pipelineCreateInfo,(VkPipelineColorBlendStateCreateInfo *)local_748)
  ;
  if (local_710 != (pointer)0x0) {
    operator_delete(local_710,(long)local_700 - (long)local_710);
  }
  local_6b8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6b8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6b8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6b8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
  local_6b8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_6b8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  (local_6b8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->x = 0.0;
  (local_6b8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->y = 0.0;
  (local_6b8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->width = 256.0;
  (local_6b8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->height = 256.0;
  (local_6b8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->minDepth = 0.0;
  (local_6b8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->maxDepth = 1.0;
  local_678.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_678.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_678.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6b8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_6b8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_678.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
  local_678.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_678.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  ((local_678.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
    super__Vector_impl_data._M_start)->offset).x = 0;
  ((local_678.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
    super__Vector_impl_data._M_start)->offset).y = 0;
  ((local_678.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
    super__Vector_impl_data._M_start)->extent).width = 0x100;
  ((local_678.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
    super__Vector_impl_data._M_start)->extent).height = 0x100;
  local_678.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_678.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
       super__Vector_impl_data._M_finish;
  PipelineCreateInfo::ViewportState::ViewportState
            ((ViewportState *)local_748,1,&local_6b8,&local_678);
  PipelineCreateInfo::addState(&pipelineCreateInfo,(VkPipelineViewportStateCreateInfo *)local_748);
  if (local_700 != (pointer)0x0) {
    operator_delete(local_700,(long)local_6f0 - (long)local_700);
  }
  if (local_718 != (pointer)0x0) {
    operator_delete(local_718,(long)local_708 - (long)local_718);
  }
  if (local_678.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_678.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_678.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_678.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_6b8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6b8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_6b8.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6b8.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_2f8,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_318,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  _front.super_VkStencilOpState.depthFailOp = local_2f8.depthFailOp;
  _front.super_VkStencilOpState.failOp = local_2f8.failOp;
  _front.super_VkStencilOpState.passOp = local_2f8.passOp;
  _front.super_VkStencilOpState.compareOp = local_2f8.compareOp;
  _front.super_VkStencilOpState.compareMask = local_2f8.compareMask;
  _front.super_VkStencilOpState.writeMask = local_2f8.writeMask;
  _front.super_VkStencilOpState.reference = local_2f8.reference;
  _back.super_VkStencilOpState.depthFailOp = local_318.depthFailOp;
  _back.super_VkStencilOpState.failOp = local_318.failOp;
  _back.super_VkStencilOpState.passOp = local_318.passOp;
  _back.super_VkStencilOpState.compareOp = local_318.compareOp;
  _back.super_VkStencilOpState.compareMask = local_318.compareMask;
  _back.super_VkStencilOpState.writeMask = local_318.writeMask;
  _back.super_VkStencilOpState.reference = local_318.reference;
  PipelineCreateInfo::DepthStencilState::DepthStencilState
            ((DepthStencilState *)local_748,0,0,VK_COMPARE_OP_ALWAYS,0,0,_front,_back,0.0,1.0);
  PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineDepthStencilStateCreateInfo *)local_748);
  PipelineCreateInfo::RasterizerState::RasterizerState
            ((RasterizerState *)local_748,0,0,VK_POLYGON_MODE_FILL,0,VK_FRONT_FACE_CLOCKWISE,1,0.0,
             0.0,0.0,1.0);
  PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineRasterizationStateCreateInfo *)local_748);
  local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       (deUint64)operator_new(4);
  local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       (local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal + 4);
  *(undefined4 *)local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       0xffffffff;
  local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       (VkDevice)
       local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  PipelineCreateInfo::MultiSampleState::MultiSampleState
            ((MultiSampleState *)local_748,VK_SAMPLE_COUNT_1_BIT,0,0.0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_6d8,false,false);
  PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineMultisampleStateCreateInfo *)local_748);
  if (local_718 != (pointer)0x0) {
    operator_delete(local_718,(long)local_708 - (long)local_718);
  }
  if ((VkAttachmentReference)
      local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal !=
      (VkAttachmentReference)0x0) {
    operator_delete((void *)local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                            m_internal,
                    (long)local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                          m_device -
                    local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                    m_internal);
  }
  ::vk::createGraphicsPipeline
            (&local_6d8,this->m_vk,pVVar19,(VkPipelineCache)0x0,
             &pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo,(VkAllocationCallbacks *)0x0);
  pVVar15 = local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  pVVar19 = local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  pDVar6 = local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  HVar14.m_internal =
       local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_738._M_allocated_capacity =
       (size_type)local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  local_738._8_8_ =
       local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_748._0_8_ =
       local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_748._8_8_ =
       local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_04.m_internal =
       (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  if (obj_04.m_internal == 0) {
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
         pVVar19;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
         pVVar15;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
         HVar14.m_internal;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
         pDVar6;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               obj_04);
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
         (VkDevice)local_738._M_allocated_capacity;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)local_738._8_8_;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
         local_748._0_8_;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_748._8_8_;
    if (local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                (&local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                 (VkPipeline)
                 local_6d8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
    }
  }
  if (pipelineCreateInfo.m_multisampleStateSampleMask.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_multisampleStateSampleMask.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_multisampleStateSampleMask.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_multisampleStateSampleMask.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_scissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_scissors.
                    super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_scissors.
                          super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_scissors.
                          super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_viewports.
      super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_viewports.
                    super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_viewports.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_viewports.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_dynamicStates.
      super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_dynamicStates.
                    super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_dynamicStates.
                          super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_dynamicStates.
                          super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_colorBlendStateAttachments.
      super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_colorBlendStateAttachments.
                    super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_colorBlendStateAttachments.
                          super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_colorBlendStateAttachments.
                          super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_shaders.
      super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_shaders.
                    super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_shaders.
                          super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_shaders.
                          super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_628.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_620,local_628);
  }
  if (uVar10 != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&DStack_640,(VkShaderModule)uVar10);
  }
  if (colorAttachments.
      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(colorAttachments.
                    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)colorAttachments.
                          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)colorAttachments.
                          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  RenderPassCreateInfo::~RenderPassCreateInfo(&renderPassCreateInfo);
  if (targetImageCreateInfo.m_queueFamilyIndices.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(targetImageCreateInfo.m_queueFamilyIndices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)targetImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)targetImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pipelineLayoutCreateInfo.m_pushConstantRanges.
      super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineLayoutCreateInfo.m_pushConstantRanges.
                    super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineLayoutCreateInfo.m_pushConstantRanges.
                          super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineLayoutCreateInfo.m_pushConstantRanges.
                          super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineLayoutCreateInfo.m_setLayouts.
      super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineLayoutCreateInfo.m_setLayouts.
                    super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineLayoutCreateInfo.m_setLayouts.
                          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineLayoutCreateInfo.m_setLayouts.
                          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DrawTestInstanceBase::initialize (const DrawParamsBase& data)
{
	m_data	= data;

	const vk::VkDevice	device				= m_context.getDevice();
	const deUint32		queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	const PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
	m_pipelineLayout						= vk::createPipelineLayout(m_vk, device, &pipelineLayoutCreateInfo);

	const vk::VkExtent3D targetImageExtent	= { WIDTH, HEIGHT, 1 };
	const ImageCreateInfo targetImageCreateInfo(vk::VK_IMAGE_TYPE_2D, m_colorAttachmentFormat, targetImageExtent, 1, 1, vk::VK_SAMPLE_COUNT_1_BIT,
		vk::VK_IMAGE_TILING_OPTIMAL, vk::VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT | vk::VK_IMAGE_USAGE_TRANSFER_DST_BIT);

	m_colorTargetImage						= Image::createAndAlloc(m_vk, device, targetImageCreateInfo, m_context.getDefaultAllocator());

	const ImageViewCreateInfo colorTargetViewInfo(m_colorTargetImage->object(), vk::VK_IMAGE_VIEW_TYPE_2D, m_colorAttachmentFormat);
	m_colorTargetView						= vk::createImageView(m_vk, device, &colorTargetViewInfo);

	RenderPassCreateInfo renderPassCreateInfo;
	renderPassCreateInfo.addAttachment(AttachmentDescription(m_colorAttachmentFormat,
															 vk::VK_SAMPLE_COUNT_1_BIT,
															 vk::VK_ATTACHMENT_LOAD_OP_LOAD,
															 vk::VK_ATTACHMENT_STORE_OP_STORE,
															 vk::VK_ATTACHMENT_LOAD_OP_DONT_CARE,
															 vk::VK_ATTACHMENT_STORE_OP_STORE,
															 vk::VK_IMAGE_LAYOUT_GENERAL,
															 vk::VK_IMAGE_LAYOUT_GENERAL));

	const vk::VkAttachmentReference colorAttachmentReference =
	{
		0,
		vk::VK_IMAGE_LAYOUT_GENERAL
	};

	renderPassCreateInfo.addSubpass(SubpassDescription(vk::VK_PIPELINE_BIND_POINT_GRAPHICS,
													   0,
													   0,
													   DE_NULL,
													   1,
													   &colorAttachmentReference,
													   DE_NULL,
													   AttachmentReference(),
													   0,
													   DE_NULL));

	m_renderPass		= vk::createRenderPass(m_vk, device, &renderPassCreateInfo);

	std::vector<vk::VkImageView> colorAttachments(1);
	colorAttachments[0] = *m_colorTargetView;

	const FramebufferCreateInfo framebufferCreateInfo(*m_renderPass, colorAttachments, WIDTH, HEIGHT, 1);

	m_framebuffer		= vk::createFramebuffer(m_vk, device, &framebufferCreateInfo);

	const vk::VkVertexInputBindingDescription vertexInputBindingDescription =
	{
		0,
		(deUint32)sizeof(tcu::Vec4) * 2,
		vk::VK_VERTEX_INPUT_RATE_VERTEX,
	};

	const vk::VkVertexInputAttributeDescription vertexInputAttributeDescriptions[2] =
	{
		{
			0u,
			0u,
			vk::VK_FORMAT_R32G32B32A32_SFLOAT,
			0u
		},
		{
			1u,
			0u,
			vk::VK_FORMAT_R32G32B32A32_SFLOAT,
			(deUint32)(sizeof(float)* 4),
		}
	};

	m_vertexInputState = PipelineCreateInfo::VertexInputState(1,
															  &vertexInputBindingDescription,
															  2,
															  vertexInputAttributeDescriptions);

	const vk::VkDeviceSize dataSize = m_data.vertices.size() * sizeof(PositionColorVertex);
	m_vertexBuffer = Buffer::createAndAlloc(m_vk, device, BufferCreateInfo(dataSize,
		vk::VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), m_context.getDefaultAllocator(), vk::MemoryRequirement::HostVisible);

	deUint8* ptr = reinterpret_cast<deUint8*>(m_vertexBuffer->getBoundMemory().getHostPtr());
	deMemcpy(ptr, &(m_data.vertices[0]), static_cast<size_t>(dataSize));

	vk::flushMappedMemoryRange(m_vk,
							   device,
							   m_vertexBuffer->getBoundMemory().getMemory(),
							   m_vertexBuffer->getBoundMemory().getOffset(),
							   VK_WHOLE_SIZE);

	const CmdPoolCreateInfo cmdPoolCreateInfo(queueFamilyIndex);
	m_cmdPool	= vk::createCommandPool(m_vk, device, &cmdPoolCreateInfo);
	m_cmdBuffer	= vk::allocateCommandBuffer(m_vk, device, *m_cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	initPipeline(device);
}